

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_report_load_balance(REF_GRID ref_grid,REF_INT npart,REF_INT *node_part)

{
  REF_NODE pRVar1;
  REF_MPI ref_mpi_00;
  void *value;
  REF_INT local_60;
  REF_INT local_5c;
  int local_54;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT *partition_size;
  REF_INT proc;
  REF_INT node;
  REF_INT max_part;
  REF_INT min_part;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_INT *node_part_local;
  REF_INT npart_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  ref_mpi_00 = ref_grid->mpi;
  if (ref_mpi_00->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x112
           ,"ref_migrate_report_load_balance","malloc partition_size of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    value = malloc((long)ref_mpi_00->n << 2);
    if (value == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x112,"ref_migrate_report_load_balance","malloc partition_size of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (local_54 = 0; local_54 < ref_mpi_00->n; local_54 = local_54 + 1) {
        *(undefined4 *)((long)value + (long)local_54 * 4) = 0;
      }
      for (partition_size._4_4_ = 0; (int)partition_size._4_4_ < pRVar1->max;
          partition_size._4_4_ = partition_size._4_4_ + 1) {
        if ((((-1 < (int)partition_size._4_4_) && ((int)partition_size._4_4_ < pRVar1->max)) &&
            (-1 < pRVar1->global[(int)partition_size._4_4_])) &&
           (pRVar1->ref_mpi->id == pRVar1->part[(int)partition_size._4_4_])) {
          if ((node_part[(int)partition_size._4_4_] < 0) ||
             (ref_mpi_00->n <= node_part[(int)partition_size._4_4_])) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x11a,"ref_migrate_report_load_balance","part out of range");
            printf("rank %d node %d node_part %d n %d",(ulong)(uint)ref_mpi_00->id,
                   (ulong)partition_size._4_4_,(ulong)(uint)node_part[(int)partition_size._4_4_],
                   (ulong)(uint)ref_mpi_00->n);
            return 1;
          }
          *(int *)((long)value + (long)node_part[(int)partition_size._4_4_] * 4) =
               *(int *)((long)value + (long)node_part[(int)partition_size._4_4_] * 4) + 1;
        }
      }
      ref_grid_local._4_4_ = ref_mpi_allsum(ref_mpi_00,value,ref_mpi_00->n,1);
      if (ref_grid_local._4_4_ == 0) {
        node = 0x7fffffff;
        proc = 0;
        for (partition_size._0_4_ = 0; (int)partition_size < npart;
            partition_size._0_4_ = (int)partition_size + 1) {
          if (node < *(int *)((long)value + (long)(int)partition_size * 4)) {
            local_5c = node;
          }
          else {
            local_5c = *(REF_INT *)((long)value + (long)(int)partition_size * 4);
          }
          node = local_5c;
          if (*(int *)((long)value + (long)(int)partition_size * 4) < proc) {
            local_60 = proc;
          }
          else {
            local_60 = *(REF_INT *)((long)value + (long)(int)partition_size * 4);
          }
          proc = local_60;
        }
        if (ref_mpi_00->id == 0) {
          printf("balance %6.3f on %d of %d target %d size min %d max %d\n",
                 ((double)proc / (double)pRVar1->old_n_global) * (double)npart,(ulong)(uint)npart,
                 (ulong)(uint)ref_mpi_00->n,pRVar1->old_n_global / (long)npart & 0xffffffff,
                 (ulong)(uint)node,(ulong)(uint)proc);
        }
        if (value != (void *)0x0) {
          free(value);
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x11f,"ref_migrate_report_load_balance",(ulong)ref_grid_local._4_4_,"allsum");
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_report_load_balance(REF_GRID ref_grid,
                                                          REF_INT npart,
                                                          REF_INT *node_part) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT min_part, max_part, node, proc, *partition_size;
  ref_malloc_init(partition_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RAB(0 <= node_part[node] && node_part[node] < ref_mpi_n(ref_mpi),
          "part out of range", {
            printf("rank %d node %d node_part %d n %d", ref_mpi_rank(ref_mpi),
                   node, node_part[node], ref_mpi_n(ref_mpi));
          });
      partition_size[node_part[node]] += 1;
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, partition_size, ref_mpi_n(ref_mpi), REF_INT_TYPE),
      "allsum");

  min_part = INT_MAX;
  max_part = 0;
  for (proc = 0; proc < npart; proc++) {
    min_part = MIN(min_part, partition_size[proc]);
    max_part = MAX(max_part, partition_size[proc]);
  }

  if (ref_mpi_once(ref_mpi)) {
    printf("balance %6.3f on %d of %d target %d size min %d max %d\n",
           (REF_DBL)max_part / (REF_DBL)ref_node_n_global(ref_node) *
               (REF_DBL)npart,
           npart, ref_mpi_n(ref_mpi),
           (REF_INT)(ref_node_n_global(ref_node) / (REF_GLOB)npart), min_part,
           max_part);
  }
  ref_free(partition_size);
  return REF_SUCCESS;
}